

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_transaction.cpp
# Opt level: O2

int CfdFinalizeMultisigSign
              (void *handle,void *multisign_handle,int net_type,char *tx_hex_string,char *txid,
              uint32_t vout,int hash_type,char *redeem_script,char **tx_string)

{
  bool bVar1;
  uint uVar2;
  CfdException *pCVar3;
  ulong uVar4;
  char *pcVar5;
  char *pcVar6;
  allocator local_242;
  bool is_bitcoin;
  void *local_240;
  AddressType local_234;
  void *local_230;
  string local_228;
  char *local_208;
  uint32_t local_200;
  int local_1fc;
  Script script;
  SignParameter param;
  OutPoint outpoint;
  vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_> sign_list;
  Script witness_script_obj;
  Script redeem_script_obj;
  
  local_230 = multisign_handle;
  local_208 = tx_hex_string;
  local_200 = vout;
  local_1fc = net_type;
  cfd::Initialize();
  std::__cxx11::string::string((string *)&param,"MultisigSign",(allocator *)&witness_script_obj);
  cfd::capi::CheckBuffer(local_230,(string *)&param);
  std::__cxx11::string::~string((string *)&param);
  bVar1 = cfd::capi::IsEmptyString(local_208);
  if (bVar1) {
    param.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = "cfdcapi_transaction.cpp";
    param.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish._0_4_ = 0x7e8;
    param.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = "CfdFinalizeMultisigSign";
    cfd::core::logger::warn<>((CfdSourceLocation *)&param,"tx is null or empty.");
    pCVar3 = (CfdException *)__cxa_allocate_exception(0x30);
    std::__cxx11::string::string
              ((string *)&param,"Failed to parameter. tx is null or empty.",
               (allocator *)&witness_script_obj);
    cfd::core::CfdException::CfdException(pCVar3,kCfdIllegalArgumentError,(string *)&param);
    __cxa_throw(pCVar3,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  bVar1 = cfd::capi::IsEmptyString(txid);
  if (bVar1) {
    param.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = "cfdcapi_transaction.cpp";
    param.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish._0_4_ = 0x7ee;
    param.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = "CfdFinalizeMultisigSign";
    cfd::core::logger::warn<>((CfdSourceLocation *)&param,"txid is null or empty.");
    pCVar3 = (CfdException *)__cxa_allocate_exception(0x30);
    std::__cxx11::string::string
              ((string *)&param,"Failed to parameter. txid is null or empty.",
               (allocator *)&witness_script_obj);
    cfd::core::CfdException::CfdException(pCVar3,kCfdIllegalArgumentError,(string *)&param);
    __cxa_throw(pCVar3,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  bVar1 = cfd::capi::IsEmptyString(redeem_script);
  if (bVar1) {
    param.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = "cfdcapi_transaction.cpp";
    param.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish._0_4_ = 0x7f4;
    param.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = "CfdFinalizeMultisigSign";
    cfd::core::logger::warn<>((CfdSourceLocation *)&param,"redeemScript is null or empty.");
    pCVar3 = (CfdException *)__cxa_allocate_exception(0x30);
    std::__cxx11::string::string
              ((string *)&param,"Failed to parameter. redeemScript is null or empty.",
               (allocator *)&witness_script_obj);
    cfd::core::CfdException::CfdException(pCVar3,kCfdIllegalArgumentError,(string *)&param);
    __cxa_throw(pCVar3,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  if (tx_string == (char **)0x0) {
    param.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = "cfdcapi_transaction.cpp";
    param.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish._0_4_ = 0x7fa;
    param.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = "CfdFinalizeMultisigSign";
    cfd::core::logger::warn<>((CfdSourceLocation *)&param,"tx output is null.");
    pCVar3 = (CfdException *)__cxa_allocate_exception(0x30);
    std::__cxx11::string::string
              ((string *)&param,"Failed to parameter. tx output is null.",
               (allocator *)&witness_script_obj);
    cfd::core::CfdException::CfdException(pCVar3,kCfdIllegalArgumentError,(string *)&param);
    __cxa_throw(pCVar3,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  local_234 = cfd::capi::ConvertHashToAddressType(hash_type);
  cfd::core::Script::Script(&witness_script_obj);
  cfd::core::Script::Script(&redeem_script_obj);
  if (local_234 == kP2shAddress) {
    std::__cxx11::string::string((string *)&script,redeem_script,(allocator *)&outpoint);
    cfd::core::Script::Script((Script *)&param,(string *)&script);
    cfd::core::Script::operator=(&redeem_script_obj,(Script *)&param);
  }
  else {
    if (local_234 != kP2wshAddress) {
      if (local_234 != kP2shP2wshAddress) {
        param.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start = "cfdcapi_transaction.cpp";
        param.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish._0_4_ = 0x810;
        param.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = "CfdFinalizeMultisigSign";
        cfd::core::logger::warn<>((CfdSourceLocation *)&param,"pkh is not target.");
        pCVar3 = (CfdException *)__cxa_allocate_exception(0x30);
        std::__cxx11::string::string
                  ((string *)&param,"Failed to parameter. hash type cannot used pkh target.",
                   (allocator *)&script);
        cfd::core::CfdException::CfdException(pCVar3,kCfdIllegalArgumentError,(string *)&param);
        __cxa_throw(pCVar3,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException
                   );
      }
      std::__cxx11::string::string((string *)&script,redeem_script,(allocator *)&outpoint);
      cfd::core::Script::Script((Script *)&param,(string *)&script);
      cfd::core::Script::operator=(&witness_script_obj,(Script *)&param);
      cfd::core::Script::~Script((Script *)&param);
      std::__cxx11::string::~string((string *)&script);
      cfd::core::ScriptUtil::CreateP2shLockingScript((Script *)&param,&witness_script_obj);
      cfd::core::Script::operator=(&redeem_script_obj,(Script *)&param);
      cfd::core::Script::~Script((Script *)&param);
      goto LAB_003b4bd8;
    }
    std::__cxx11::string::string((string *)&script,redeem_script,(allocator *)&outpoint);
    cfd::core::Script::Script((Script *)&param,(string *)&script);
    cfd::core::Script::operator=(&witness_script_obj,(Script *)&param);
  }
  cfd::core::Script::~Script((Script *)&param);
  std::__cxx11::string::~string((string *)&script);
LAB_003b4bd8:
  uVar2 = *(uint *)((long)local_230 + 0x15c8);
  if (uVar2 == 0) {
    param.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = "cfdcapi_transaction.cpp";
    param.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish._0_4_ = 0x819;
    param.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = "CfdFinalizeMultisigSign";
    cfd::core::logger::warn<>((CfdSourceLocation *)&param,"The signature has empty.");
    pCVar3 = (CfdException *)__cxa_allocate_exception(0x30);
    std::__cxx11::string::string((string *)&param,"The signature has empty.",(allocator *)&script);
    cfd::core::CfdException::CfdException(pCVar3,kCfdOutOfRangeError,(string *)&param);
    __cxa_throw(pCVar3,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  local_240 = handle;
  if (uVar2 < 0x15) {
    sign_list.super__Vector_base<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    sign_list.super__Vector_base<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    sign_list.super__Vector_base<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    pcVar6 = (char *)((long)local_230 + 0x10);
    pcVar5 = (char *)((long)local_230 + 0xb8c);
    for (uVar4 = 0; uVar4 < uVar2; uVar4 = uVar4 + 1) {
      std::__cxx11::string::string((string *)&script,pcVar6,(allocator *)&local_228);
      cfd::core::ByteData::ByteData((ByteData *)&outpoint,(string *)&script);
      cfd::SignParameter::SignParameter(&param,(ByteData *)&outpoint);
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&outpoint);
      std::__cxx11::string::~string((string *)&script);
      std::__cxx11::string::string((string *)&script,pcVar5,(allocator *)&outpoint);
      cfd::core::ByteData::ByteData((ByteData *)&outpoint,(string *)&script);
      bVar1 = cfd::core::Pubkey::IsValid((ByteData *)&outpoint);
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&outpoint);
      if (bVar1) {
        cfd::core::Pubkey::Pubkey((Pubkey *)&outpoint,(string *)&script);
        cfd::SignParameter::SetRelatedPubkey(&param,(Pubkey *)&outpoint);
        std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                  ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&outpoint);
      }
      std::vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>::push_back
                (&sign_list,&param);
      std::__cxx11::string::~string((string *)&script);
      cfd::SignParameter::~SignParameter(&param);
      uVar2 = *(uint *)((long)local_230 + 0x15c8);
      pcVar6 = pcVar6 + 0x93;
      pcVar5 = pcVar5 + 0x83;
    }
    is_bitcoin = false;
    cfd::capi::ConvertNetType(local_1fc,&is_bitcoin);
    std::__cxx11::string::string((string *)&script,txid,(allocator *)&local_228);
    cfd::core::Txid::Txid((Txid *)&param,(string *)&script);
    cfd::core::OutPoint::OutPoint(&outpoint,(Txid *)&param,local_200);
    cfd::core::Txid::~Txid((Txid *)&param);
    std::__cxx11::string::~string((string *)&script);
    std::__cxx11::string::string((string *)&param,redeem_script,(allocator *)&local_228);
    cfd::core::Script::Script(&script,(string *)&param);
    std::__cxx11::string::~string((string *)&param);
    if (is_bitcoin == true) {
      std::__cxx11::string::string((string *)&local_228,local_208,&local_242);
      cfd::TransactionContext::TransactionContext((TransactionContext *)&param,&local_228);
      std::__cxx11::string::~string((string *)&local_228);
      cfd::TransactionContext::AddMultisigSign
                ((TransactionContext *)&param,&outpoint,&sign_list,&script,local_234);
      cfd::core::AbstractTransaction::GetHex_abi_cxx11_(&local_228,(AbstractTransaction *)&param);
      pcVar6 = cfd::capi::CreateString(&local_228);
      *tx_string = pcVar6;
      std::__cxx11::string::~string((string *)&local_228);
      cfd::TransactionContext::~TransactionContext((TransactionContext *)&param);
    }
    else {
      std::__cxx11::string::string((string *)&local_228,local_208,&local_242);
      cfd::ConfidentialTransactionContext::ConfidentialTransactionContext
                ((ConfidentialTransactionContext *)&param,&local_228);
      std::__cxx11::string::~string((string *)&local_228);
      cfd::ConfidentialTransactionContext::AddMultisigSign
                ((ConfidentialTransactionContext *)&param,&outpoint,&sign_list,&script,local_234);
      cfd::core::AbstractTransaction::GetHex_abi_cxx11_(&local_228,(AbstractTransaction *)&param);
      pcVar6 = cfd::capi::CreateString(&local_228);
      *tx_string = pcVar6;
      std::__cxx11::string::~string((string *)&local_228);
      cfd::ConfidentialTransactionContext::~ConfidentialTransactionContext
                ((ConfidentialTransactionContext *)&param);
    }
    cfd::core::Script::~Script(&script);
    cfd::core::Txid::~Txid(&outpoint.txid_);
    std::vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>::~vector(&sign_list);
    cfd::core::Script::~Script(&redeem_script_obj);
    cfd::core::Script::~Script(&witness_script_obj);
    return 0;
  }
  param.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = "cfdcapi_transaction.cpp";
  param.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish._0_4_ = 0x81f;
  param.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = "CfdFinalizeMultisigSign";
  cfd::core::logger::warn<>
            ((CfdSourceLocation *)&param,"The number of signature has reached the upper limit.");
  pCVar3 = (CfdException *)__cxa_allocate_exception(0x30);
  std::__cxx11::string::string
            ((string *)&param,"The number of signature has reached the upper limit.",
             (allocator *)&script);
  cfd::core::CfdException::CfdException(pCVar3,kCfdOutOfRangeError,(string *)&param);
  __cxa_throw(pCVar3,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
}

Assistant:

int CfdFinalizeMultisigSign(
    void* handle, void* multisign_handle, int net_type,
    const char* tx_hex_string, const char* txid, uint32_t vout, int hash_type,
    const char* redeem_script, char** tx_string) {
  try {
    cfd::Initialize();
    CheckBuffer(multisign_handle, kPrefixMultisigSignData);
    if (IsEmptyString(tx_hex_string)) {
      warn(CFD_LOG_SOURCE, "tx is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. tx is null or empty.");
    }
    if (IsEmptyString(txid)) {
      warn(CFD_LOG_SOURCE, "txid is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. txid is null or empty.");
    }
    if (IsEmptyString(redeem_script)) {
      warn(CFD_LOG_SOURCE, "redeemScript is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. redeemScript is null or empty.");
    }
    if (tx_string == nullptr) {
      warn(CFD_LOG_SOURCE, "tx output is null.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. tx output is null.");
    }

    AddressType addr_type = ConvertHashToAddressType(hash_type);
    Script witness_script_obj;
    Script redeem_script_obj;
    switch (addr_type) {
      case AddressType::kP2shAddress:
        redeem_script_obj = Script(std::string(redeem_script));
        break;
      case AddressType::kP2wshAddress:
        witness_script_obj = Script(std::string(redeem_script));
        break;
      case AddressType::kP2shP2wshAddress:
        witness_script_obj = Script(std::string(redeem_script));
        redeem_script_obj =
            ScriptUtil::CreateP2shLockingScript(witness_script_obj);
        break;
      default:
        warn(CFD_LOG_SOURCE, "pkh is not target.");
        throw CfdException(
            CfdError::kCfdIllegalArgumentError,
            "Failed to parameter. hash type cannot used pkh target.");
    }

    CfdCapiMultisigSignData* data =
        static_cast<CfdCapiMultisigSignData*>(multisign_handle);
    if (data->current_index == 0) {
      warn(CFD_LOG_SOURCE, "The signature has empty.");
      throw CfdException(
          CfdError::kCfdOutOfRangeError, "The signature has empty.");
    }
    if (data->current_index > kMultisigMaxKeyNum) {
      warn(
          CFD_LOG_SOURCE,
          "The number of signature has reached the upper limit.");
      throw CfdException(
          CfdError::kCfdOutOfRangeError,
          "The number of signature has reached the upper limit.");
    }

    std::vector<SignParameter> sign_list;
    for (uint32_t index = 0; index < data->current_index; ++index) {
      SignParameter param(ByteData(std::string(data->signatures[index])));
      std::string pubkey(data->pubkeys[index]);
      if (Pubkey::IsValid(ByteData(pubkey))) {
        param.SetRelatedPubkey(Pubkey(pubkey));
      }
      sign_list.push_back(param);
    }

    bool is_bitcoin = false;
    ConvertNetType(net_type, &is_bitcoin);
    OutPoint outpoint(Txid(txid), vout);
    Script script = Script(std::string(redeem_script));
    if (is_bitcoin) {
      TransactionContext tx(tx_hex_string);
      tx.AddMultisigSign(outpoint, sign_list, script, addr_type);
      *tx_string = CreateString(tx.GetHex());
    } else {
#ifndef CFD_DISABLE_ELEMENTS
      ConfidentialTransactionContext tx(tx_hex_string);
      tx.AddMultisigSign(outpoint, sign_list, script, addr_type);
      *tx_string = CreateString(tx.GetHex());
#else
      throw CfdException(
          CfdError::kCfdIllegalArgumentError, "Elements is not supported.");
#endif  // CFD_DISABLE_ELEMENTS
    }

    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    return SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
    return CfdErrorCode::kCfdUnknownError;
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
    return CfdErrorCode::kCfdUnknownError;
  }
}